

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Quadtree.h
# Opt level: O2

void __thiscall
quadtree::
Quadtree<Node_*,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/pvigier[P]Quadtree/examples/physics.cpp:64:19),_std::equal_to<Node_*>,_float>
::query(Quadtree<Node_*,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_pvigier[P]Quadtree_examples_physics_cpp:64:19),_std::equal_to<Node_*>,_float>
        *this,Node *node,Box<float> *box,Box<float> *queryBox,
       vector<Node_*,_std::allocator<Node_*>_> *values)

{
  value_type *ppNVar1;
  long lVar2;
  undefined8 this_00;
  bool bVar3;
  Box<float> *extraout_RDX;
  Box<float> *extraout_RDX_00;
  Box<float> *extraout_RDX_01;
  Box<float> *extraout_RDX_02;
  Box<float> *pBVar4;
  Node **value;
  value_type *__x;
  size_t i;
  ulong uVar5;
  undefined1 auStack_50 [8];
  Box<float> childBox;
  
  ppNVar1 = *(value_type **)&this[1].mBox.width;
  pBVar4 = box;
  childBox._8_8_ = node;
  for (__x = *(value_type **)&this[1].mBox; this_00 = childBox._8_8_, __x != ppNVar1; __x = __x + 1)
  {
    _auStack_50 = (*__x)->box;
    bVar3 = Box<float>::intersects(box,(Box<float> *)auStack_50);
    pBVar4 = extraout_RDX;
    if (bVar3) {
      std::vector<Node_*,_std::allocator<Node_*>_>::push_back
                ((vector<Node_*,_std::allocator<Node_*>_> *)queryBox,__x);
      pBVar4 = extraout_RDX_00;
    }
  }
  lVar2._0_4_ = (this->mBox).left;
  lVar2._4_4_ = (this->mBox).top;
  if (lVar2 != 0) {
    for (uVar5 = 0; uVar5 != 4; uVar5 = uVar5 + 1) {
      _auStack_50 = computeBox((Quadtree<Node_*,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_pvigier[P]Quadtree_examples_physics_cpp:64:19),_std::equal_to<Node_*>,_float>
                                *)this_00,(Box<float> *)(uVar5 & 0xffffffff),(int)pBVar4);
      bVar3 = Box<float>::intersects(box,(Box<float> *)auStack_50);
      pBVar4 = extraout_RDX_01;
      if (bVar3) {
        query(*(Quadtree<Node_*,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_pvigier[P]Quadtree_examples_physics_cpp:64:19),_std::equal_to<Node_*>,_float>
                **)(&(this->mBox).left + uVar5 * 2),(Node *)auStack_50,box,queryBox,values);
        pBVar4 = extraout_RDX_02;
      }
    }
  }
  return;
}

Assistant:

void query(Node* node, const Box<Float>& box, const Box<Float>& queryBox, std::vector<T>& values) const
    {
        assert(node != nullptr);
        assert(queryBox.intersects(box));
        for (const auto& value : node->values)
        {
            if (queryBox.intersects(mGetBox(value)))
                values.push_back(value);
        }
        if (!isLeaf(node))
        {
            for (auto i = std::size_t(0); i < node->children.size(); ++i)
            {
                auto childBox = computeBox(box, static_cast<int>(i));
                if (queryBox.intersects(childBox))
                    query(node->children[i].get(), childBox, queryBox, values);
            }
        }
    }